

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O1

GMM_TILE_TYPE __thiscall GmmLib::GmmResourceInfoCommon::GetTileType(GmmResourceInfoCommon *this)

{
  anon_struct_8_44_94931171_for_Info aVar1;
  GMM_TILE_TYPE GVar2;
  
  aVar1 = (this->Surf).Flags.Info;
  GVar2 = GMM_TILED_W;
  if ((((((ulong)aVar1 >> 0x22 & 1) == 0) && (GVar2 = GMM_TILED_X, ((ulong)aVar1 >> 0x23 & 1) == 0))
      && (GVar2 = GMM_TILED_Y, ((ulong)aVar1 >> 0x24 & 1) == 0)) &&
     (GVar2 = GMM_TILED_4, ((ulong)aVar1 >> 0x2b & 1) == 0)) {
    GVar2 = (aVar1._4_4_ >> 0xc & 1) * 2 + GMM_NOT_TILED;
  }
  return GVar2;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED GMM_TILE_TYPE GMM_STDCALL GetTileType()
            {
                if (Surf.Flags.Info.TiledW)
                {
                    return GMM_TILED_W;
                }
                else if (Surf.Flags.Info.TiledX)
                {
                    return GMM_TILED_X;
                }
                // Surf.Flags.Info.TiledYs/Yf tiling are only in
                // conjunction with Surf.Flags.Info.TiledY/Linear depending on resource type (1D).
                else if (Surf.Flags.Info.TiledY)
                {
                    return GMM_TILED_Y;
                }
                else if (Surf.Flags.Info.Tile4)
                {
                    return GMM_TILED_4;
                }
                else if (Surf.Flags.Info.Tile64)
                {
                    return GMM_TILED_64;
                }

                return GMM_NOT_TILED;
            }